

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::SectionTemplateNode::AddTemplateNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template,string *indentation)

{
  TemplateTemplateNode *this_00;
  TemplateTemplateNode *local_38;
  byte local_29;
  string *psStack_28;
  bool success;
  string *indentation_local;
  Template *my_template_local;
  TemplateToken *token_local;
  SectionTemplateNode *this_local;
  
  psStack_28 = indentation;
  indentation_local = (string *)my_template;
  my_template_local = (Template *)token;
  token_local = (TemplateToken *)this;
  if (token != (TemplateToken *)0x0) {
    local_29 = 1;
    this_00 = (TemplateTemplateNode *)operator_new(0x80);
    TemplateTemplateNode::TemplateTemplateNode
              (this_00,(TemplateToken *)my_template_local,*(Strip *)(indentation_local + 0x50),
               psStack_28);
    local_38 = this_00;
    std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
    push_back(&this->node_list_,(value_type *)&local_38);
    return (bool)(local_29 & 1);
  }
  __assert_fail("token",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x68d,
                "bool ctemplate::SectionTemplateNode::AddTemplateNode(TemplateToken *, Template *, const string &)"
               );
}

Assistant:

bool SectionTemplateNode::AddTemplateNode(TemplateToken* token,
                                          Template* my_template,
                                          const string& indentation) {
  assert(token);
  bool success = true;
  node_list_.push_back(
      new TemplateTemplateNode(*token, my_template->strip_, indentation));
  return success;
}